

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_authentication(connectdata *conn)

{
  _Bool _Var1;
  saslprogress local_2c;
  anon_union_240_10_26c073a1_for_proto *paStack_28;
  saslprogress progress;
  pop3_conn *pop3c;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  pop3c._4_4_ = CURLE_OK;
  paStack_28 = &conn->proto;
  local_2c = SASL_IDLE;
  pcStack_18 = conn;
  _Var1 = Curl_sasl_can_authenticate((SASL *)&(conn->proto).imapc.sasl.prefmech,conn);
  if (_Var1) {
    if (((((paStack_28->ftpc).prevmethod & (paStack_28->pop3c).preftype & 4) != 0) &&
        (pop3c._4_4_ = Curl_sasl_start((SASL *)&(paStack_28->imapc).sasl.prefmech,pcStack_18,false,
                                       &local_2c), pop3c._4_4_ == CURLE_OK)) &&
       (local_2c == SASL_INPROGRESS)) {
      state(pcStack_18,POP3_AUTH);
    }
    if ((pop3c._4_4_ == CURLE_OK) && (local_2c == SASL_IDLE)) {
      if (((paStack_28->ftpc).prevmethod & (paStack_28->pop3c).preftype & FTPFILE_NOCWD) == 0) {
        if (((paStack_28->ftpc).prevmethod & (paStack_28->pop3c).preftype & FTPFILE_MULTICWD) == 0)
        {
          Curl_infof(pcStack_18->data,"No known authentication mechanisms supported!\n");
          pop3c._4_4_ = CURLE_LOGIN_DENIED;
        }
        else {
          pop3c._4_4_ = pop3_perform_user(pcStack_18);
        }
      }
      else {
        pop3c._4_4_ = pop3_perform_apop(pcStack_18);
      }
    }
    conn_local._4_4_ = pop3c._4_4_;
  }
  else {
    state(pcStack_18,POP3_STOP);
    conn_local._4_4_ = pop3c._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  saslprogress progress = SASL_IDLE;

  /* Check we have enough data to authenticate with and end the
     connect phase if we don't */
  if(!Curl_sasl_can_authenticate(&pop3c->sasl, conn)) {
    state(conn, POP3_STOP);
    return result;
  }

  if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_SASL) {
    /* Calculate the SASL login details */
    result = Curl_sasl_start(&pop3c->sasl, conn, FALSE, &progress);

    if(!result)
      if(progress == SASL_INPROGRESS)
        state(conn, POP3_AUTH);
  }

  if(!result && progress == SASL_IDLE) {
#ifndef CURL_DISABLE_CRYPTO_AUTH
    if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_APOP)
      /* Perform APOP authentication */
      result = pop3_perform_apop(conn);
    else
#endif
    if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_CLEARTEXT)
      /* Perform clear text authentication */
      result = pop3_perform_user(conn);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}